

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMultiProcessHandler::CheckResourceAvailability(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color index;
  mapped_type *errors;
  _Base_ptr p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  allocations;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  local_60;
  
  if (this->UseResourceSpec == true) {
    p_Var2 = (this->PendingTests).
             super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->PendingTests).
              super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var1) {
      do {
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        index = p_Var2[1]._M_color;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        errors = std::
                 map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAvailabilityError>_>_>_>_>_>
                 ::operator[](&this->ResourceAvailabilityErrors,(key_type_conflict1 *)(p_Var2 + 1));
        TryAllocateResources
                  (this,index,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
                    *)&local_60,errors);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
        ::~_Rb_tree(&local_60);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CheckResourceAvailability()
{
  if (this->UseResourceSpec) {
    for (auto const& t : this->PendingTests) {
      std::map<std::string, std::vector<cmCTestBinPackerAllocation>>
        allocations;
      this->TryAllocateResources(t.first, allocations,
                                 &this->ResourceAvailabilityErrors[t.first]);
    }
  }
}